

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::Eval
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  JobManager *this_00;
  string *psVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this_01;
  char *pcVar7;
  bool bVar8;
  Status SVar9;
  ssize_t sVar10;
  const_iterator cVar11;
  Value *pVVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  Interpreter *pIVar16;
  undefined1 *puVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  undefined1 *puVar18;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  uint64_t xpan;
  Expression retExpr;
  writer write;
  int cancelData;
  string local_328;
  undefined1 local_308 [32];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8;
  parse_func local_2e0 [1];
  undefined1 local_2d8 [8];
  _Alloc_hider local_2d0;
  undefined1 local_2c8 [8];
  char local_2c0 [16];
  _Alloc_hider local_2b0;
  pointer local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  pointer local_290;
  pointer local_288;
  element_type *local_280;
  Expression local_278;
  StringArray local_258;
  Expression *local_238;
  undefined1 local_22c [12];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  ErrorCode local_200;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  ErrorCode local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  ErrorCode local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  ErrorCode local_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  ErrorCode local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  ErrorCode local_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  ErrorCode local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  ErrorCode local_e8;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  Error local_c0;
  Error local_98;
  Error local_70;
  undefined1 local_48 [24];
  
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mError).mCode = kNone;
  local_290 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_288 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  LOCK();
  (this->mCancelCommand)._M_base._M_i = false;
  UNLOCK();
  do {
    sVar10 = read(this->mCancelPipe[0],local_22c,4);
    this_01 = mEvaluatorMap_abi_cxx11_;
  } while (sVar10 != -1);
  utils::ToLower((string *)local_2d8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
           ::find(this_01,(key_type *)local_2d8);
  if ((undefined1 *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_) != local_2c8) {
    operator_delete((undefined1 *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_));
  }
  if ((_Rb_tree_header *)cVar11._M_node ==
      &(mEvaluatorMap_abi_cxx11_->_M_impl).super__Rb_tree_header) {
    local_308._0_4_ = 0xd;
    pcVar15 = "\'{}\' is not a valid command, type \'help\' to list all commands";
    local_308._8_8_ = "\'{}\' is not a valid command, type \'help\' to list all commands";
    local_308._16_8_ = 0x3d;
    local_308._24_8_ = 0x100000000;
    local_2e0[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_2e8 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_308;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_308;
    local_238 = aExpr;
    do {
      if (pcVar15 == "") break;
      pcVar14 = pcVar15;
      if (*pcVar15 == '{') {
LAB_00250fae:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_258,pcVar15,pcVar14);
        pcVar15 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                            (pcVar14,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_308);
        bVar8 = true;
      }
      else {
        pcVar14 = pcVar15 + 1;
        bVar8 = pcVar14 != "";
        if (bVar8) {
          if (*pcVar14 != '{') {
            pcVar7 = pcVar15 + 2;
            do {
              pcVar14 = pcVar7;
              bVar8 = pcVar14 != "";
              if (pcVar14 == "") goto LAB_00250faa;
              pcVar7 = pcVar14 + 1;
            } while (*pcVar14 != '{');
          }
          bVar8 = true;
        }
LAB_00250faa:
        if (bVar8) goto LAB_00250fae;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_258,pcVar15,"");
        bVar8 = false;
      }
    } while (bVar8);
    pbVar2 = (local_238->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_308._0_8_ = (pbVar2->_M_dataplus)._M_p;
    local_308._8_8_ = pbVar2->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x3d;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_308;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_328,(v10 *)"\'{}\' is not a valid command, type \'help\' to list all commands"
               ,fmt,args_00);
    local_e8 = kInvalidCommand;
    puVar18 = local_d0;
    local_e0 = puVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_328._M_dataplus._M_p,
               local_328._M_dataplus._M_p + local_328._M_string_length);
    local_2d8._0_4_ = local_e8;
    local_2d0._M_p = local_2c0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_e0,local_e0 + local_d8);
    local_2a8 = (pointer)0x0;
    local_2a0._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2d8._0_4_;
    local_2b0._M_p = (pointer)&local_2a0;
    std::__cxx11::string::operator=((string *)local_290,(string *)&local_2d0);
    std::__cxx11::string::operator=((string *)local_288,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p);
    }
    puVar17 = local_e0;
    if (local_2d0._M_p != local_2c0) {
      operator_delete(local_2d0._M_p);
      puVar17 = local_e0;
    }
    goto LAB_00251445;
  }
  MultiNetCommandContext::Cleanup(&this->mContext);
  ReParseMultiNetworkSyntax(&local_70,this,aExpr,&local_278);
  local_2d8._0_4_ = local_70.mCode;
  local_2d0._M_p = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_70.mMessage._M_dataplus._M_p,
             local_70.mMessage._M_dataplus._M_p + local_70.mMessage._M_string_length);
  local_2a8 = (pointer)0x0;
  local_2a0._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_2d8._0_4_;
  local_2b0._M_p = (pointer)&local_2a0;
  std::__cxx11::string::operator=((string *)local_290,(string *)&local_2d0);
  std::__cxx11::string::operator=((string *)local_288,(string *)&local_2b0);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p);
  }
  if (local_2d0._M_p != local_2c0) {
    operator_delete(local_2d0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mMessage._M_dataplus._M_p != &local_70.mMessage.field_2) {
    operator_delete(local_70.mMessage._M_dataplus._M_p);
  }
  if (EVar1 == kNone) {
    pbVar2 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 0x21) {
      pbVar4 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pIVar16 = (Interpreter *)((long)pbVar5 - (long)pbVar4);
      if ((Interpreter *)0x20 < pIVar16) {
        local_308._0_8_ = (ulong)(uint)local_308._4_4_ << 0x20;
        pcVar15 = "multiple files not allowed for --import";
        local_308._8_8_ = "multiple files not allowed for --import";
        local_308._16_8_ = 0x27;
        local_308._24_8_ = 0;
        local_2e0[0] = (parse_func)0x0;
        local_2e8 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_308;
        local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_308;
        do {
          if (pcVar15 == "") break;
          pcVar14 = pcVar15;
          if (*pcVar15 == '{') {
LAB_0025131d:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&local_258,pcVar15,pcVar14);
            pcVar15 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar14,"",(format_string_checker<char> *)local_308);
            bVar8 = true;
          }
          else {
            pcVar14 = pcVar15 + 1;
            bVar8 = pcVar14 != "";
            if (bVar8) {
              if (*pcVar14 != '{') {
                pcVar7 = pcVar15 + 2;
                do {
                  pcVar14 = pcVar7;
                  bVar8 = pcVar14 != "";
                  if (pcVar14 == "") goto LAB_00251319;
                  pcVar7 = pcVar14 + 1;
                } while (*pcVar14 != '{');
              }
              bVar8 = true;
            }
LAB_00251319:
            if (bVar8) goto LAB_0025131d;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&local_258,pcVar15,"");
            bVar8 = false;
          }
        } while (bVar8);
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)local_308;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_328,(v10 *)"multiple files not allowed for --import",
                   (string_view)ZEXT816(0x27),args_02);
        local_138 = kInvalidArgs;
        puVar18 = local_120;
        local_130 = puVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_328._M_dataplus._M_p,
                   local_328._M_dataplus._M_p + local_328._M_string_length);
        local_2d8._0_4_ = local_138;
        local_2d0._M_p = local_2c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,local_130,local_130 + local_128);
        local_2a8 = (pointer)0x0;
        local_2a0._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2d8._0_4_;
        local_2b0._M_p = (pointer)&local_2a0;
        std::__cxx11::string::operator=((string *)local_290,(string *)&local_2d0);
        std::__cxx11::string::operator=((string *)local_288,(string *)&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_p != &local_2a0) {
          operator_delete(local_2b0._M_p);
        }
        puVar17 = local_130;
        if (local_2d0._M_p != local_2c0) {
          operator_delete(local_2d0._M_p);
          puVar17 = local_130;
        }
        goto LAB_00251445;
      }
      if (pbVar3 == pbVar2) {
        if (pbVar5 == pbVar4) {
LAB_00251717:
          pbVar2 = (this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = (this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pbVar3 == pbVar2) &&
             ((this->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            if ((this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              local_280 = (element_type *)0x0;
              if (pbVar2 == pbVar3) {
                SVar9 = persistent_storage::Registry::GetCurrentNetworkXpan
                                  ((this->mRegistry).
                                   super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(uint64_t *)&local_280);
                if (SVar9 != kSuccess) {
                  local_280 = (element_type *)0x0;
                }
LAB_00251b60:
                JobManager::AppendImport
                          (&local_c0,
                           (this->mJobManager).
                           super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(uint64_t)local_280,&local_278);
                local_2d8._0_4_ = local_c0.mCode;
                local_2d0._M_p = local_2c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2d0,local_c0.mMessage._M_dataplus._M_p,
                           local_c0.mMessage._M_dataplus._M_p + local_c0.mMessage._M_string_length);
                local_2a8 = (pointer)0x0;
                local_2a0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                pVVar12 = Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
                EVar1 = (pVVar12->mError).mCode;
                Value::~Value((Value *)local_2d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0.mMessage._M_dataplus._M_p != &local_c0.mMessage.field_2) {
                  operator_delete(local_c0.mMessage._M_dataplus._M_p);
                }
                iVar13 = 6;
                if (EVar1 == kNone) {
                  iVar13 = 0;
                }
              }
              else {
                local_328._M_dataplus._M_p = (pointer)0x0;
                local_328._M_string_length = 0;
                local_328.field_2._M_allocated_capacity = 0;
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                SVar9 = persistent_storage::Registry::GetNetworkXpansByAliases
                                  ((this->mRegistry).
                                   super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(StringArray *)this,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_328,&local_258);
                if (SVar9 == kSuccess) {
                  local_280 = *(element_type **)local_328._M_dataplus._M_p;
                  iVar13 = 0;
                }
                else {
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  args_07.field_1.args_ = in_R9.args_;
                  args_07.desc_ = (unsigned_long_long)local_48;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_308,(v10 *)"Failed to resolve network alias for import"
                             ,(string_view)ZEXT816(0x2a),args_07);
                  local_22c._4_4_ = kInvalidArgs;
                  local_220 = local_210;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,local_308._0_8_,
                             (char *)(local_308._8_8_ + local_308._0_8_));
                  local_2d8._0_4_ = local_22c._4_4_;
                  local_2d0._M_p = local_2c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2d0,local_220,local_220 + local_218);
                  local_2a8 = (pointer)0x0;
                  local_2a0._M_local_buf[0] = '\0';
                  local_2b0._M_p = (pointer)&local_2a0;
                  Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
                  Value::~Value((Value *)local_2d8);
                  if (local_220 != local_210) {
                    operator_delete(local_220);
                  }
                  if ((Interpreter *)local_308._0_8_ != (Interpreter *)(local_308 + 0x10)) {
                    operator_delete((void *)local_308._0_8_);
                  }
                  iVar13 = 6;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_258);
                if ((uint64_t *)local_328._M_dataplus._M_p != (uint64_t *)0x0) {
                  operator_delete(local_328._M_dataplus._M_p);
                }
                if (SVar9 == kSuccess) goto LAB_00251b60;
              }
              if (iVar13 != 0) goto joined_r0x0025179d;
            }
            if (cVar11._M_node[2]._M_left == (_Base_ptr)0x0) {
              local_308._0_8_ = this;
              std::__throw_bad_function_call();
            }
            local_308._0_8_ = this;
            (*(code *)cVar11._M_node[2]._M_right)(local_2d8,cVar11._M_node + 2,local_308,&local_278)
            ;
            Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
            Value::~Value((Value *)local_2d8);
          }
          else {
            local_328._M_dataplus._M_p = (pointer)0x0;
            local_328._M_string_length = 0;
            local_328.field_2._M_allocated_capacity = 0;
            ValidateMultiNetworkSyntax
                      ((Value *)local_2d8,this,&local_278,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_328);
            pIVar16 = (Interpreter *)local_2d8;
            pVVar12 = Value::operator=(__return_storage_ptr__,(Value *)pIVar16);
            EVar1 = (pVVar12->mError).mCode;
            Value::~Value((Value *)pIVar16);
            iVar13 = 6;
            if (EVar1 == kNone) {
              bVar8 = IsFeatureSupported(pIVar16,mMultiJobExecution_abi_cxx11_,&local_278);
              if (bVar8) {
                this_00 = (this->mJobManager).
                          super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                bVar8 = MultiNetCommandContext::HasGroupAlias(&this->mContext);
                JobManager::PrepareJobs
                          (&local_98,this_00,&local_278,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_328,bVar8
                          );
                local_2d8._0_4_ = local_98.mCode;
                local_2d0._M_p = local_2c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2d0,local_98.mMessage._M_dataplus._M_p,
                           local_98.mMessage._M_dataplus._M_p + local_98.mMessage._M_string_length);
                local_2a8 = (pointer)0x0;
                local_2a0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                pVVar12 = Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
                EVar1 = (pVVar12->mError).mCode;
                Value::~Value((Value *)local_2d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98.mMessage._M_dataplus._M_p != &local_98.mMessage.field_2) {
                  operator_delete(local_98.mMessage._M_dataplus._M_p);
                }
                if (EVar1 == kNone) {
                  JobManager::RunJobs((this->mJobManager).
                                      super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                  JobManager::CollectJobsValue
                            ((Value *)local_2d8,
                             (this->mJobManager).
                             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
LAB_00251adf:
                  Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
                  Value::~Value((Value *)local_2d8);
                  iVar13 = 0;
                }
              }
              else {
                if ((this->mContext).mImportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    (this->mContext).mImportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  if (cVar11._M_node[2]._M_left == (_Base_ptr)0x0) {
                    local_308._0_8_ = this;
                    std::__throw_bad_function_call();
                  }
                  local_308._0_8_ = this;
                  (*(code *)cVar11._M_node[2]._M_right)
                            (local_2d8,cVar11._M_node + 2,local_308,&local_278);
                  goto LAB_00251adf;
                }
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_06.field_1.args_ = in_R9.args_;
                args_06.desc_ = (unsigned_long_long)&local_258;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_308,
                           (v10 *)
                           "Import syntax is not supported in synchronous processing of multi-network command"
                           ,(string_view)ZEXT816(0x51),args_06);
                local_200 = kInvalidArgs;
                local_1f8 = local_1e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f8,local_308._0_8_,
                           (char *)(local_308._8_8_ + local_308._0_8_));
                local_2d8._0_4_ = local_200;
                local_2d0._M_p = local_2c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2d0,local_1f8,local_1f8 + local_1f0);
                local_2a8 = (pointer)0x0;
                local_2a0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
                Value::~Value((Value *)local_2d8);
                if (local_1f8 != local_1e8) {
                  operator_delete(local_1f8);
                }
                if ((Interpreter *)local_308._0_8_ != (Interpreter *)(local_308 + 0x10)) {
                  operator_delete((void *)local_308._0_8_);
                }
              }
            }
            if ((uint64_t *)local_328._M_dataplus._M_p != (uint64_t *)0x0) {
              operator_delete(local_328._M_dataplus._M_p);
            }
            if (iVar13 == 0) goto LAB_00251462;
joined_r0x0025179d:
            if (iVar13 != 6) {
              Value::~Value(__return_storage_ptr__);
              goto LAB_0025146b;
            }
          }
          goto LAB_00251462;
        }
        bVar8 = IsFeatureSupported(pIVar16,mImportSyntax_abi_cxx11_,&local_278);
        if (bVar8) {
          if ((this->mContext).mExportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mExportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            JobManager::SetImportFile
                      ((this->mJobManager).
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(this->mContext).mImportFiles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            goto LAB_00251717;
          }
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_308,(v10 *)"--export and --import are mutually exclusive",
                     (string_view)ZEXT816(0x2c),args_03);
          local_1d8 = kInvalidArgs;
          puVar18 = local_1c0;
          local_1d0 = puVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,local_308._0_8_,
                     (char *)(local_308._8_8_ + local_308._0_8_));
          local_2d8._0_4_ = local_1d8;
          local_2d0._M_p = local_2c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_1d0,local_1d0 + local_1c8);
          local_2a8 = (pointer)0x0;
          local_2a0._M_local_buf[0] = '\0';
          local_2b0._M_p = (pointer)&local_2a0;
          Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
          Value::~Value((Value *)local_2d8);
          puVar17 = local_1d0;
        }
        else {
          ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
          local_328._M_dataplus._M_p = "--import";
          fmt_01.size_ = 0xc;
          fmt_01.data_ = (char *)0x24;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_308,(v10 *)"\'{}\' is not supported by the command",fmt_01,
                     args_05);
          local_1b0 = kInvalidArgs;
          puVar18 = local_198;
          local_1a8 = puVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_308._0_8_,
                     (char *)(local_308._8_8_ + local_308._0_8_));
          local_2d8._0_4_ = local_1b0;
          local_2d0._M_p = local_2c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_1a8,local_1a8 + local_1a0);
          local_2a8 = (pointer)0x0;
          local_2a0._M_local_buf[0] = '\0';
          local_2b0._M_p = (pointer)&local_2a0;
          Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
          Value::~Value((Value *)local_2d8);
          puVar17 = local_1a8;
        }
      }
      else {
        bVar8 = IsFeatureSupported(pIVar16,mExportSyntax_abi_cxx11_,&local_278);
        if (bVar8) {
          if ((this->mContext).mImportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mImportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) goto LAB_00251717;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_308,(v10 *)"--export and --import are mutually exclusive",
                     (string_view)ZEXT816(0x2c),args);
          local_188 = kInvalidArgs;
          puVar18 = local_170;
          local_180 = puVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,local_308._0_8_,
                     (char *)(local_308._8_8_ + local_308._0_8_));
          local_2d8._0_4_ = local_188;
          local_2d0._M_p = local_2c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_180,local_180 + local_178);
          local_2a8 = (pointer)0x0;
          local_2a0._M_local_buf[0] = '\0';
          local_2b0._M_p = (pointer)&local_2a0;
          Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
          Value::~Value((Value *)local_2d8);
          puVar17 = local_180;
        }
        else {
          ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
          local_328._M_dataplus._M_p = "--export";
          fmt_00.size_ = 0xc;
          fmt_00.data_ = (char *)0x24;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_308,(v10 *)"\'{}\' is not supported by the command",fmt_00,
                     args_04);
          local_160 = kInvalidArgs;
          puVar18 = local_148;
          local_158 = puVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_308._0_8_,
                     (char *)(local_308._8_8_ + local_308._0_8_));
          local_2d8._0_4_ = local_160;
          local_2d0._M_p = local_2c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_158,local_158 + local_150);
          local_2a8 = (pointer)0x0;
          local_2a0._M_local_buf[0] = '\0';
          local_2b0._M_p = (pointer)&local_2a0;
          Value::operator=(__return_storage_ptr__,(Value *)local_2d8);
          Value::~Value((Value *)local_2d8);
          puVar17 = local_158;
        }
      }
      if (puVar17 != puVar18) {
        operator_delete(puVar17);
      }
      psVar6 = (string *)local_308;
    }
    else {
      local_308._0_8_ = (ulong)(uint)local_308._4_4_ << 0x20;
      pcVar15 = "multiple files not allowed for --export";
      local_308._8_8_ = "multiple files not allowed for --export";
      local_308._16_8_ = 0x27;
      local_308._24_8_ = 0;
      local_2e0[0] = (parse_func)0x0;
      local_2e8 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_308;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_308;
      do {
        if (pcVar15 == "") break;
        pcVar14 = pcVar15;
        if (*pcVar15 == '{') {
LAB_0025116e:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_258,pcVar15,pcVar14);
          pcVar15 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar14,"",(format_string_checker<char> *)local_308);
          bVar8 = true;
        }
        else {
          pcVar14 = pcVar15 + 1;
          bVar8 = pcVar14 != "";
          if (bVar8) {
            if (*pcVar14 != '{') {
              pcVar7 = pcVar15 + 2;
              do {
                pcVar14 = pcVar7;
                bVar8 = pcVar14 != "";
                if (pcVar14 == "") goto LAB_0025116a;
                pcVar7 = pcVar14 + 1;
              } while (*pcVar14 != '{');
            }
            bVar8 = true;
          }
LAB_0025116a:
          if (bVar8) goto LAB_0025116e;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_258,pcVar15,"");
          bVar8 = false;
        }
      } while (bVar8);
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_308;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_328,(v10 *)"multiple files not allowed for --export",
                 (string_view)ZEXT816(0x27),args_01);
      local_110 = kInvalidArgs;
      puVar18 = local_f8;
      local_108 = puVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_328._M_dataplus._M_p,
                 local_328._M_dataplus._M_p + local_328._M_string_length);
      local_2d8._0_4_ = local_110;
      local_2d0._M_p = local_2c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_108,local_108 + local_100);
      local_2a8 = (pointer)0x0;
      local_2a0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_2d8._0_4_;
      local_2b0._M_p = (pointer)&local_2a0;
      std::__cxx11::string::operator=((string *)local_290,(string *)&local_2d0);
      std::__cxx11::string::operator=((string *)local_288,(string *)&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_p != &local_2a0) {
        operator_delete(local_2b0._M_p);
      }
      puVar17 = local_108;
      if (local_2d0._M_p != local_2c0) {
        operator_delete(local_2d0._M_p);
        puVar17 = local_108;
      }
LAB_00251445:
      if (puVar17 != puVar18) {
        operator_delete(puVar17);
      }
      psVar6 = &local_328;
    }
    puVar18 = (undefined1 *)(&(psVar6->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18 != &psVar6->field_2) {
      operator_delete(puVar18);
    }
  }
LAB_00251462:
  JobManager::CleanupJobs
            ((this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_0025146b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::Eval(const Expression &aExpr)
{
    Expression retExpr;
    bool       supported;
    Value      value;
    int        cancelData;

    mCancelCommand = false;
    // empty the pipe prior to starting command execution
    while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
        ;

    // make sure first the command is known
    auto evaluator = mEvaluatorMap.find(ToLower(aExpr.front()));
    if (evaluator == mEvaluatorMap.end())
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_COMMAND, aExpr.front()));
    }
    // prepare for parsing next command
    mContext.Cleanup();

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));

    if (mContext.mExportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mExportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_EXPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mImportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
    }
    else if (mContext.mImportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mImportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_IMPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mExportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
        // let job manager take care of import data
        mJobManager->SetImportFile(mContext.mImportFiles.front());
    }

    if (mContext.mNwkAliases.size() > 0 || mContext.mDomAliases.size() > 0)
    {
        std::vector<uint64_t> nids;

        SuccessOrExit(value = ValidateMultiNetworkSyntax(retExpr, nids));
        if (IsMultiJob(retExpr)) // asynchronous processing required
        {
            SuccessOrExit(value = mJobManager->PrepareJobs(retExpr, nids, mContext.HasGroupAlias()));
            mJobManager->RunJobs();
            value = mJobManager->CollectJobsValue();
        }
        else // synchronous processing possible
        {
            // with multi-network syntax in effect an import semantics
            // is allowed for job-based processing only (see mImportSyntax)
            VerifyOrExit(mContext.mImportFiles.size() == 0,
                         value = ERROR_INVALID_ARGS(
                             "Import syntax is not supported in synchronous processing of multi-network command"));

            value = evaluator->second(this, retExpr);
        }
    }
    else
    {
        // handle single command using selected network
        if (mContext.mImportFiles.size() > 0)
        {
            uint64_t xpan = 0;
            if (mContext.mNwkAliases.empty())
            {
                auto result = mRegistry->GetCurrentNetworkXpan(xpan);
                if (result != Registry::Status::kSuccess)
                {
                    xpan = 0;
                }
            }
            else
            {
                std::vector<uint64_t> nwks;
                StringArray           unresolved;
                VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, nwks, unresolved) ==
                                 Registry::Status::kSuccess,
                             value = ERROR_INVALID_ARGS("Failed to resolve network alias for import"));
                xpan = nwks[0];
            }
            SuccessOrExit(value = mJobManager->AppendImport(xpan, retExpr));
        }
        value = evaluator->second(this, retExpr);
    }
exit:
    // It is necessary to cleanup import file anyways
    mJobManager->CleanupJobs();
    return value;
}